

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

Image * GetTextureData(Texture2D texture)

{
  Texture2D texture_00;
  void *pvVar1;
  char *text;
  int logType;
  Image *in_RDI;
  undefined8 unaff_retaddr;
  uint in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000018;
  
  in_RDI->data = (void *)0x0;
  in_RDI->width = 0;
  in_RDI->height = 0;
  in_RDI->mipmaps = 0;
  in_RDI->format = 0;
  if (in_stack_00000018 < 0xb) {
    texture_00.height = in_stack_00000008;
    texture_00._0_8_ = unaff_retaddr;
    texture_00.mipmaps = in_stack_0000000c;
    texture_00.format = in_stack_00000010;
    pvVar1 = rlReadTexturePixels(texture_00);
    in_RDI->data = pvVar1;
    if (pvVar1 != (void *)0x0) {
      in_RDI->width = in_stack_0000000c;
      in_RDI->height = in_stack_00000010;
      in_RDI->format = in_stack_00000018;
      in_RDI->mipmaps = 1;
      text = "TEXTURE: [ID %i] Pixel data retrieved successfully";
      logType = 3;
      goto LAB_00143a52;
    }
    text = "TEXTURE: [ID %i] Failed to retrieve pixel data";
  }
  else {
    text = "TEXTURE: [ID %i] Failed to retrieve compressed pixel data";
  }
  logType = 4;
LAB_00143a52:
  TraceLog(logType,text,(ulong)in_stack_00000008);
  return in_RDI;
}

Assistant:

Image GetTextureData(Texture2D texture)
{
    Image image = { 0 };

    if (texture.format < PIXELFORMAT_COMPRESSED_DXT1_RGB)
    {
        image.data = rlReadTexturePixels(texture);

        if (image.data != NULL)
        {
            image.width = texture.width;
            image.height = texture.height;
            image.format = texture.format;
            image.mipmaps = 1;

#if defined(GRAPHICS_API_OPENGL_ES2)
            // NOTE: Data retrieved on OpenGL ES 2.0 should be RGBA,
            // coming from FBO color buffer attachment, but it seems
            // original texture format is retrieved on RPI...
            image.format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;
#endif
            TRACELOG(LOG_INFO, "TEXTURE: [ID %i] Pixel data retrieved successfully", texture.id);
        }
        else TRACELOG(LOG_WARNING, "TEXTURE: [ID %i] Failed to retrieve pixel data", texture.id);
    }
    else TRACELOG(LOG_WARNING, "TEXTURE: [ID %i] Failed to retrieve compressed pixel data", texture.id);

    return image;
}